

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall
c4::yml::detail::stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::push
          (stack<c4::yml::detail::ReferenceResolver::refdata,_16UL> *this,refdata *n)

{
  size_t sVar1;
  refdata *prVar2;
  code *pcVar3;
  NodeType_e NVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  bool bVar8;
  size_t sVar9;
  
  if ((this->m_stack <= n + 1) && (n <= this->m_stack + this->m_capacity)) {
    if ((s_error_flags & 1) != 0) {
      bVar8 = is_debugger_attached();
      if (bVar8) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    (*(code *)PTR_error_impl_00240518)
              ("check failed: (const char*)&n + sizeof(T) < (const char*)m_stack || &n > m_stack + m_capacity"
               ,0x5d,(anonymous_namespace)::s_default_callbacks);
  }
  sVar1 = this->m_capacity;
  if (this->m_size == sVar1) {
    sVar9 = 0x10;
    if (sVar1 != 0) {
      sVar9 = sVar1 * 2;
    }
    reserve(this,sVar9);
  }
  prVar2 = this->m_stack;
  sVar1 = this->m_size;
  NVar4 = (n->type).type;
  sVar9 = n->node;
  sVar5 = n->prev_anchor;
  sVar6 = n->target;
  sVar7 = n->parent_ref_sibling;
  prVar2[sVar1].parent_ref = n->parent_ref;
  (&prVar2[sVar1].parent_ref)[1] = sVar7;
  prVar2[sVar1].prev_anchor = sVar5;
  (&prVar2[sVar1].prev_anchor)[1] = sVar6;
  prVar2[sVar1].type.type = NVar4;
  prVar2[sVar1].node = sVar9;
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

void push(T const& C4_RESTRICT n)
    {
        RYML_ASSERT((const char*)&n + sizeof(T) < (const char*)m_stack || &n > m_stack + m_capacity);
        if(m_size == m_capacity)
        {
            size_t cap = m_capacity == 0 ? N : 2 * m_capacity;
            reserve(cap);
        }
        m_stack[m_size] = n;
        ++m_size;
    }